

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

bool amrex::(anonymous_namespace)::(anonymous_namespace)::squeryval<std::__cxx11::string>
               (Table *table,string *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ptr,int ival,
               int occurrence)

{
  PP_entry *pp;
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  char local_2a [2];
  
  pp = anon_unknown_12::ppindex(table,occurrence,name,false);
  if (pp != (PP_entry *)0x0) {
    if ((int)((ulong)((long)(pp->m_vals).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pp->m_vals).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= ival) {
      poVar1 = ErrorStream();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"ParmParse::queryval no value number",0x23);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,ival);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," for ",5);
      poVar1 = ErrorStream();
      if (occurrence == -1) {
        pcVar3 = "last occurrence of ";
        lVar2 = 0x13;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," occurrence ",0xc);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,occurrence);
        pcVar3 = " of ";
        lVar2 = 4;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
      poVar1 = ErrorStream();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(pp->m_name)._M_dataplus._M_p,(pp->m_name)._M_string_length);
      local_2a[0] = '\n';
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a,1);
      amrex::operator<<(poVar1,pp);
      local_2a[1] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a + 1,1);
      Abort_host((char *)0x0);
    }
    std::__cxx11::string::_M_assign((string *)ptr);
  }
  return pp != (PP_entry *)0x0;
}

Assistant:

bool
squeryval (const ParmParse::Table& table,
           const std::string& name,
           T&           ptr,
           int          ival,
           int          occurrence)
{
    //
    // Get last occurrence of name in table.
    //
    const ParmParse::PP_entry* def = ppindex(table, occurrence, name, false);
    if ( def == 0 )
    {
        return false;
    }
    //
    // Does it have ival values?
    //
    if ( ival >= static_cast<int>(def->m_vals.size()) )
    {
        amrex::ErrorStream() << "ParmParse::queryval no value number"
                  << ival << " for ";
        if ( occurrence ==  ParmParse::LAST )
        {
            amrex::ErrorStream() << "last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n' << *def << '\n';
        amrex::Abort();
    }

    const std::string& valname = def->m_vals[ival];

    bool ok = is(valname, ptr);
    if ( !ok )
    {
        amrex::ErrorStream() << "ParmParse::queryval type mismatch on value number "
                  << ival << " of " << '\n';
        if ( occurrence == ParmParse::LAST )
        {
            amrex::ErrorStream() << " last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence number " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n';
        amrex::ErrorStream() << " Expected an \""
                  << tok_name(ptr)
                  << "\" type  which can't be parsed from the string \""
                  << valname << "\"\n"
                  << *def << '\n';
        amrex::Abort();
    }
    return true;
}